

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O3

int fits_translate_keyword
              (char *inrec,char *outrec,char *(*patterns) [2],int npat,int n_value,int n_offset,
              int n_range,int *pat_num,int *i,int *j,int *m,int *n,int *status)

{
  byte *pbVar1;
  bool bVar2;
  byte bVar3;
  byte bVar4;
  uint uVar5;
  ushort **ppuVar6;
  byte bVar7;
  char cVar8;
  int iVar9;
  byte bVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  byte *pbVar17;
  long lVar18;
  uint uVar19;
  bool bVar20;
  byte local_96;
  byte local_95;
  int local_94;
  uint local_90;
  int local_8c;
  uint local_7c;
  
  if (0 < *status) {
    return *status;
  }
  if (inrec == (char *)0x0 || outrec == (char *)0x0) {
    *status = 0x73;
    return 0x73;
  }
  *outrec = '\0';
  if (*inrec == '\0') {
    builtin_strncpy(inrec,"        ",9);
  }
  local_95 = 0x20;
  if (npat < 1) {
    bVar20 = true;
    local_7c = 0;
    local_94 = 0;
    local_8c = 0;
    local_90 = 0;
    uVar5 = 0;
    bVar4 = local_95;
  }
  else {
    uVar15 = 0;
    bVar2 = false;
    bVar10 = 0;
    do {
      pbVar1 = (byte *)patterns[uVar15][0];
      bVar7 = *pbVar1;
      local_7c = (uint)uVar15;
      if (bVar7 == 0x2a) {
        local_90 = 0xffffffff;
        local_94 = 0;
        local_8c = 0;
        uVar5 = 0xffffffff;
        bVar20 = false;
        bVar4 = local_95;
        break;
      }
      bVar20 = true;
      local_96 = 0x20;
      local_90 = 0xffffffff;
      if ((bVar2) && (local_94 = 0, bVar7 == bVar10)) {
        local_8c = 0;
        uVar5 = 0xffffffff;
        bVar7 = bVar10;
        bVar2 = true;
      }
      else if (bVar7 == 0) {
        local_94 = 0;
        local_8c = 0;
        uVar5 = 0xffffffff;
        bVar7 = 0;
        bVar2 = true;
      }
      else {
        uVar5 = 0xffffffff;
        local_96 = 0x20;
        lVar14 = 0;
        bVar20 = true;
        bVar2 = true;
        lVar13 = 0;
        local_90 = 0xffffffff;
        local_8c = 0;
        local_94 = 0;
        bVar4 = bVar7;
        do {
          iVar9 = (int)lVar13;
          lVar18 = (long)iVar9;
          bVar10 = inrec[lVar18];
          lVar13 = (long)(char)bVar10;
          uVar19 = (uint)bVar4;
          uVar16 = uVar5;
          uVar12 = local_90;
          bVar3 = local_96;
          if (uVar19 < 0x69) {
            if (uVar19 != 0x23) {
              if (uVar19 != 0x3f) {
                if (uVar19 != 0x61) goto LAB_0017cad6;
                ppuVar6 = __ctype_b_loc();
                bVar3 = bVar10;
                if (((*(byte *)((long)*ppuVar6 + lVar13 * 2 + 1) & 1) == 0) && (bVar10 != 0x20))
                goto LAB_0017cb23;
              }
              goto LAB_0017cb5a;
            }
LAB_0017c9ed:
            ppuVar6 = __ctype_b_loc();
            if ((*(byte *)((long)*ppuVar6 + lVar13 * 2 + 1) & 8) == 0) goto LAB_0017cc55;
            iVar9 = iVar9 + -1;
            uVar11 = 0;
            do {
              if ((*(byte *)((long)*ppuVar6 + (long)(char)bVar10 * 2 + 1) & 8) == 0)
              goto LAB_0017ca45;
              uVar11 = ((int)(char)bVar10 + uVar11 * 10) - 0x30;
              bVar10 = inrec[lVar18 + 1];
              lVar18 = lVar18 + 1;
              iVar9 = iVar9 + 1;
            } while (lVar18 != 8);
            iVar9 = 7;
LAB_0017ca45:
            uVar16 = uVar11;
            if ((bVar4 != 0x6d) && (uVar16 = uVar5, uVar19 == 0x6e)) {
              if (uVar11 - 1 < 999) {
                uVar12 = uVar11;
                if (((uVar11 == n_value && n_range == 0) ||
                    (n_range == -1 && (int)uVar11 <= n_value)) ||
                   (n_range == 1 && n_value <= (int)uVar11)) goto LAB_0017cb5a;
              }
              goto LAB_0017cc55;
            }
          }
          else {
            if (uVar19 - 0x6d < 2) goto LAB_0017c9ed;
            if (uVar19 != 0x6a) {
              if (uVar19 == 0x69) {
                ppuVar6 = __ctype_b_loc();
                if ((*(byte *)((long)*ppuVar6 + lVar13 * 2 + 1) & 8) == 0) goto LAB_0017cb23;
                local_94 = (char)bVar10 + -0x30;
                goto LAB_0017cb5a;
              }
LAB_0017cad6:
              if (bVar10 == bVar4) goto LAB_0017cb5a;
LAB_0017cc55:
              bVar20 = true;
              goto LAB_0017cc71;
            }
            ppuVar6 = __ctype_b_loc();
            if ((*(byte *)((long)*ppuVar6 + lVar13 * 2 + 1) & 8) == 0) {
LAB_0017cb23:
              bVar3 = local_96;
              if (!bVar20) goto LAB_0017cb5a;
              bVar20 = true;
              goto LAB_0017cc71;
            }
            local_8c = (char)bVar10 + -0x30;
          }
LAB_0017cb5a:
          local_96 = bVar3;
          uVar5 = uVar16;
          lVar13 = (long)iVar9 + 1;
          bVar4 = pbVar1[lVar14 + 1];
          local_90 = uVar12;
          if (bVar4 == 0) break;
          lVar14 = lVar14 + 1;
          bVar2 = false;
          bVar20 = false;
        } while (iVar9 < 7);
        if (bVar7 == 0) {
          bVar20 = true;
          bVar7 = 0;
          bVar2 = false;
        }
        else {
          if ((6 < iVar9) || (bVar20 = false, inrec[lVar13] == ' ')) {
            bVar20 = false;
            local_95 = local_96;
            bVar4 = local_95;
            break;
          }
          bVar2 = false;
        }
      }
LAB_0017cc71:
      uVar15 = uVar15 + 1;
      bVar4 = local_96;
      local_7c = npat;
      bVar10 = bVar7;
    } while (uVar15 != (uint)npat);
  }
  local_95 = bVar4;
  if (i != (int *)0x0) {
    *i = local_94;
  }
  if (j != (int *)0x0) {
    *j = local_8c;
  }
  if (n != (int *)0x0) {
    *n = local_90;
  }
  if (m != (int *)0x0) {
    *m = uVar5;
  }
  if (pat_num != (int *)0x0) {
    *pat_num = local_7c;
  }
  if (bVar20) {
    return 0;
  }
  pbVar1 = (byte *)patterns[local_7c][1];
  bVar4 = *pbVar1;
  if (bVar4 == 0) {
    return (uint)bVar4;
  }
  if (bVar4 == 0x2d) {
    if ((pbVar1[1] == 0x2d) && (pbVar1[2] == 0)) {
      outrec[0] = '-';
      outrec[1] = '\0';
      strncat(outrec,inrec,8);
      outrec[9] = '\0';
      uVar15 = 9;
      do {
        uVar5 = (int)uVar15 - 1;
        uVar15 = (ulong)uVar5;
        if (outrec[uVar15] != ' ') {
          return 0;
        }
        outrec[uVar15] = '\0';
      } while (2 < uVar5);
      return 0;
    }
    if (pbVar1[1] == 0) {
      return 0;
    }
  }
  strcpy(outrec,inrec);
  bVar4 = *pbVar1;
  if (bVar4 == 0x2b) {
    return 0;
  }
  lVar14 = 0;
  iVar9 = 0;
  do {
    if (bVar4 < 0x6a) {
      cVar8 = (char)local_94;
      if (bVar4 == 0x69) goto LAB_0017ce4b;
      if (bVar4 == 0) {
        if (iVar9 < 8) {
          memset(outrec + iVar9,0x20,(ulong)(7 - iVar9) + 1);
        }
        return *status;
      }
LAB_0017ce59:
      if ((bVar4 == 0x6d) && (-1 < (int)uVar5)) {
        if (0 < (int)uVar5) {
          uVar16 = 1;
          do {
            uVar16 = uVar16 * 10;
          } while (0 < (int)(uVar5 / uVar16));
          pbVar17 = (byte *)(outrec + iVar9);
          do {
            uVar15 = (ulong)uVar5 / ((ulong)uVar16 / 10);
            *pbVar17 = (char)uVar15 + (char)(uVar15 / 10) * -10 | 0x30;
            pbVar17 = pbVar17 + 1;
            iVar9 = iVar9 + 1;
            bVar20 = 99 < uVar16;
            uVar16 = uVar16 / 10;
          } while (bVar20);
        }
LAB_0017cebb:
        iVar9 = iVar9 + -1;
      }
      else {
        if (bVar4 == 0x61) {
          bVar4 = local_95;
        }
        outrec[iVar9] = bVar4;
      }
    }
    else {
      cVar8 = (char)local_8c;
      if (bVar4 == 0x6a) {
LAB_0017ce4b:
        outrec[iVar9] = cVar8 + '0';
      }
      else {
        if (bVar4 != 0x6e) goto LAB_0017ce59;
        if (local_90 == 0xffffffff) {
          local_90 = n_value;
        }
        if (0 < (int)local_90) {
          bVar20 = SCARRY4(local_90,n_offset);
          local_90 = local_90 + n_offset;
          if (local_90 != 0 && bVar20 == (int)local_90 < 0) {
            uVar16 = 1;
            do {
              uVar16 = uVar16 * 10;
            } while (0 < (int)(local_90 / uVar16));
            pbVar17 = (byte *)(outrec + iVar9);
            do {
              uVar15 = (ulong)local_90 / ((ulong)uVar16 / 10);
              *pbVar17 = (char)uVar15 + (char)(uVar15 / 10) * -10 | 0x30;
              pbVar17 = pbVar17 + 1;
              iVar9 = iVar9 + 1;
              bVar20 = 99 < uVar16;
              uVar16 = uVar16 / 10;
            } while (bVar20);
          }
          goto LAB_0017cebb;
        }
      }
    }
    iVar9 = iVar9 + 1;
    bVar4 = pbVar1[lVar14 + 1];
    lVar14 = lVar14 + 1;
  } while( true );
}

Assistant:

int fits_translate_keyword(
      char *inrec,        /* I - input string */
      char *outrec,       /* O - output converted string, or */
                          /*     a null string if input does not  */
                          /*     match any of the patterns */
      char *patterns[][2],/* I - pointer to input / output string */
                          /*     templates */
      int npat,           /* I - number of templates passed */
      int n_value,        /* I - base 'n' template value of interest */
      int n_offset,       /* I - offset to be applied to the 'n' */
                          /*     value in the output string */
      int n_range,        /* I - controls range of 'n' template */
                          /*     values of interest (-1,0, or +1) */
      int *pat_num,       /* O - matched pattern number (0 based) or -1 */
      int *i,             /* O - value of i, if any, else 0 */
      int *j,             /* O - value of j, if any, else 0 */
      int *m,             /* O - value of m, if any, else 0 */
      int *n,             /* O - value of n, if any, else 0 */

      int *status)        /* IO - error status */

/* 

Translate a keyword name to a new name, based on a set of patterns.
The user passes an array of patterns to be matched.  Input pattern
number i is pattern[i][0], and output pattern number i is
pattern[i][1].  Keywords are matched against the input patterns.  If a
match is found then the keyword is re-written according to the output
pattern.

Order is important.  The first match is accepted.  The fastest match
will be made when templates with the same first character are grouped
together.

Several characters have special meanings:

     i,j - single digits, preserved in output template
     n - column number of one or more digits, preserved in output template
     m - generic number of one or more digits, preserved in output template
     a - coordinate designator, preserved in output template
     # - number of one or more digits
     ? - any character
     * - only allowed in first character position, to match all
         keywords; only useful as last pattern in the list

i, j, n, and m are returned by the routine.

For example, the input pattern "iCTYPn" will match "1CTYP5" (if n_value
is 5); the output pattern "CTYPEi" will be re-written as "CTYPE1".
Notice that "i" is preserved.

The following output patterns are special

Special output pattern characters:

    "-" - do not copy a keyword that matches the corresponding input pattern

    "+" - copy the input unchanged

The inrec string could be just the 8-char keyword name, or the entire 
80-char header record.  Characters 9 = 80 in the input string simply get
appended to the translated keyword name.

If n_range = 0, then only keywords with 'n' equal to n_value will be 
considered as a pattern match.  If n_range = +1, then all values of 
'n' greater than or equal to n_value will be a match, and if -1, 
then values of 'n' less than or equal to n_value will match.

  This routine was written by Craig Markwardt, GSFC
*/

{
    int i1 = 0, j1 = 0, n1 = 0, m1 = 0;
    int fac;
    char a = ' ';
    char oldp;
    char c, s;
    int ip, ic, pat, pass = 0, firstfail;
    char *spat;

    if (*status > 0)
        return(*status);
    if ((inrec == 0) || (outrec == 0)) 
      return (*status = NULL_INPUT_PTR);

    *outrec = '\0';
/*
    if (*inrec == '\0') return 0;
*/

    if (*inrec == '\0')    /* expand to full 8 char blank keyword name */
       strcpy(inrec, "        ");
       
    oldp = '\0';
    firstfail = 0;

    /* ===== Pattern match stage */
    for (pat=0; pat < npat; pat++) {
      spat = patterns[pat][0];
      
      i1 = 0; j1 = 0; m1 = -1; n1 = -1; a = ' ';  /* Initialize the place-holders */
      pass = 0;
      
      /* Pass the wildcard pattern */
      if (spat[0] == '*') { 
	pass = 1;
	break;
      }
      
      /* Optimization: if we have seen this initial pattern character before,
	 then it must have failed, and we can skip the pattern */
      if (firstfail && spat[0] == oldp) continue;
      oldp = spat[0];

      /* 
	 ip = index of pattern character being matched
	 ic = index of keyname character being matched
	 firstfail = 1 if we fail on the first characteor (0=not)
      */
      
      for (ip=0, ic=0, firstfail=1;
	   (spat[ip]) && (ic < 8);
	   ip++, ic++, firstfail=0) {
	c = inrec[ic];
	s = spat[ip];

	if (s == 'i') {
	  /* Special pattern: 'i' placeholder */
	  if (isdigit(c)) { i1 = c - '0'; pass = 1;}
	} else if (s == 'j') {
	  /* Special pattern: 'j' placeholder */
	  if (isdigit(c)) { j1 = c - '0'; pass = 1;}
	} else if ((s == 'n')||(s == 'm')||(s == '#')) {
	  /* Special patterns: multi-digit number */
	  int val = 0;
	  pass = 0;
	  if (isdigit(c)) {
	    pass = 1;  /* NOTE, could fail below */
	    
	    /* Parse decimal number */
	    while (ic<8 && isdigit(c)) { 
	      val = val*10 + (c - '0');
	      ic++; c = inrec[ic];
	    }
	    ic--; c = inrec[ic];
	    
	    if (s == 'n') { 
	      
	      /* Is it a column number? */
	      if ( val >= 1 && val <= 999 &&                    /* Row range check */
		   (((n_range == 0) && (val == n_value)) ||     /* Strict equality */
		    ((n_range == -1) && (val <= n_value)) ||    /* n <= n_value */
		    ((n_range == +1) && (val >= n_value))) ) {  /* n >= n_value */
		n1 = val;
	      } else {
		pass = 0;
	      }
	    } else if (s == 'm') {
	      
	      /* Generic number */
	      m1 = val; 
	    }
	  }
	} else if (s == 'a') {
	  /* Special pattern: coordinate designator */
	  if (isupper(c) || c == ' ') { a = c; pass = 1;} 
	} else if (s == '?') {
	  /* Match any individual character */
	  pass = 1;
	} else if (c == s) {
	  /* Match a specific character */
	  pass = 1;
	} else {
	  /* FAIL */
	  pass = 0;
	}
	if (!pass) break;
      }
      
      /* Must pass to the end of the keyword.  No partial matches allowed */
      if (pass && (ic >= 8 || inrec[ic] == ' ')) break;
    }

    /* Transfer the pattern-matched numbers to the output parameters */
    if (i) { *i = i1; }
    if (j) { *j = j1; }
    if (n) { *n = n1; }
    if (m) { *m = m1; }
    if (pat_num) { *pat_num = pat; }

    /* ===== Keyword rewriting and output stage */
    spat = patterns[pat][1];

    /* Return case: explicit deletion, return '-' */
    if (pass && strcmp(spat,"--") == 0) {
      strcpy(outrec, "-");
      strncat(outrec, inrec, 8);
      outrec[9] = 0;
      for(i1=8; i1>1 && outrec[i1] == ' '; i1--) outrec[i1] = 0;
      return 0;
    }

    /* Return case: no match, or do-not-transfer pattern */
    if (pass == 0 || spat[0] == '\0' || strcmp(spat,"-") == 0) return 0;
    /* A match: we start by copying the input record to the output */
    strcpy(outrec, inrec);

    /* Return case: return the input record unchanged */
    if (spat[0] == '+') return 0;


    /* Final case: a new output pattern */
    for (ip=0, ic=0; spat[ip]; ip++, ic++) {
      s = spat[ip];
      if (s == 'i') {
	outrec[ic] = (i1+'0');
      } else if (s == 'j') {
	outrec[ic] = (j1+'0');
      } else if (s == 'n') {
	if (n1 == -1) { n1 = n_value; }
	if (n1 > 0) {
	  n1 += n_offset;
	  for (fac = 1; (n1/fac) > 0; fac *= 10);
	  fac /= 10;
	  while(fac > 0) {
	    outrec[ic] = ((n1/fac) % 10) + '0';
	    fac /= 10;
	    ic ++;
	  }
	  ic--;
	}
      } else if (s == 'm' && m1 >= 0) {
	for (fac = 1; (m1/fac) > 0; fac *= 10);
	fac /= 10;
	while(fac > 0) {
	  outrec[ic] = ((m1/fac) % 10) + '0';
	  fac /= 10;
	  ic ++;
	}
	ic --;
      } else if (s == 'a') {
	outrec[ic] = a;
      } else {
	outrec[ic] = s;
      }
    }

    /* Pad the keyword name with spaces */
    for ( ; ic<8; ic++) { outrec[ic] = ' '; }

    return(*status);
}